

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifestuff.cpp
# Opt level: O2

int AF_A_HandLower(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  int iVar2;
  DObject *this;
  bool bVar3;
  DPSprite *this_00;
  DObject *this_01;
  char *__assertion;
  double dVar4;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00553c2d;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this_01 = (DObject *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this_01 == (DObject *)0x0) {
LAB_00553b2c:
        this_01 = (DObject *)0x0;
      }
      else {
        bVar3 = DObject::IsKindOf(this_01,AActor::RegistrationInfo.MyClass);
        if (!bVar3) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00553c2d;
        }
      }
      if (numparam == 1) goto LAB_00553bac;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_00553c1d;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar3 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar3) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_00553c2d;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_00553c1d;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_00553bac:
        if (*(player_t **)&this_01[0xc].ObjectFlags != (player_t *)0x0) {
          this_00 = player_t::GetPSprite(*(player_t **)&this_01[0xc].ObjectFlags,PSP_STRIFEHANDS);
          if (this_00->State == (FState *)0x0) {
            DPSprite::SetState(this_00,(FState *)0x0,false);
          }
          else {
            dVar4 = this_00->y + 9.0;
            this_00->y = dVar4;
            if (256.0 < dVar4) {
              DPSprite::SetState(this_00,(FState *)0x0,false);
            }
            iVar2 = *(int *)(*(long *)&this_01[0xc].ObjectFlags + 0x138);
            if (0 < iVar2) {
              *(int *)(*(long *)&this_01[0xc].ObjectFlags + 0x138) = iVar2 + -1;
            }
          }
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_00553c2d;
    }
    if (this_01 == (DObject *)0x0) goto LAB_00553b2c;
  }
LAB_00553c1d:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_00553c2d:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifestuff.cpp"
                ,0x193,"int AF_A_HandLower(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_HandLower)
{
	PARAM_ACTION_PROLOGUE;

	if (self->player != nullptr)
	{
		DPSprite *psp = self->player->GetPSprite(PSP_STRIFEHANDS);

		if (psp->GetState() == nullptr)
		{
			psp->SetState(nullptr);
			return 0;
		}

		psp->y += 9;
		if (psp->y > WEAPONBOTTOM*2)
		{
			psp->SetState(nullptr);
		}

		if (self->player->extralight > 0) self->player->extralight--;
	}
	return 0;
}